

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O2

void put16bitbwtile(TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
                   int32_t fromskew,int32_t toskew,uchar *pp)

{
  ushort uVar1;
  uint32_t **ppuVar2;
  long lVar3;
  long lVar4;
  uint16_t *wp;
  uchar *puVar5;
  bool bVar6;
  
  uVar1 = img->samplesperpixel;
  ppuVar2 = img->BWmap;
  while (bVar6 = h != 0, h = h - 1, bVar6) {
    lVar3 = (long)toskew * -4;
    puVar5 = pp;
    for (lVar4 = 0; w != (uint32_t)lVar4; lVar4 = lVar4 + 1) {
      cp[lVar4] = *ppuVar2[puVar5[1]];
      puVar5 = puVar5 + (uint)uVar1 * 2;
      lVar3 = lVar3 + -4;
    }
    pp = pp + (long)fromskew + (ulong)uVar1 * (ulong)w * 2;
    cp = (uint32_t *)((long)cp - lVar3);
  }
  return;
}

Assistant:

DECLAREContigPutFunc(put16bitbwtile)
{
    int samplesperpixel = img->samplesperpixel;
    uint32_t **BWmap = img->BWmap;

    (void)y;
    for (; h > 0; --h)
    {
        uint16_t *wp = (uint16_t *)pp;

        for (x = w; x > 0; --x)
        {
            /* use high order byte of 16bit value */

            *cp++ = BWmap[*wp >> 8][0];
            pp += 2 * samplesperpixel;
            wp += samplesperpixel;
        }
        cp += toskew;
        pp += fromskew;
    }
}